

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O1

void __thiscall
MultiQuery<dto::Complex,_dto::Complex>::MultiQuery
          (MultiQuery<dto::Complex,_dto::Complex> *this,Complex *req,uint16_t port,string *addr,
          int timeout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  int iVar9;
  int optval;
  sockaddr_in remote_address;
  undefined4 local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MultiQuery","");
  Subscriber::Subscriber(&this->super_Subscriber,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_0014b780;
  uVar5 = *(undefined8 *)((req->header).cmd + 8);
  uVar6 = (req->header).cmd_seq;
  uVar3 = *(undefined4 *)((long)&(req->header).cmd_seq + 4);
  uVar7 = (req->header).param;
  uVar4 = *(undefined4 *)((long)&(req->header).param + 4);
  *(undefined8 *)(this->req).header.cmd = *(undefined8 *)(req->header).cmd;
  *(undefined8 *)((this->req).header.cmd + 8) = uVar5;
  *(int *)&(this->req).header.cmd_seq = (int)uVar6;
  *(undefined4 *)((long)&(this->req).header.cmd_seq + 4) = uVar3;
  *(int *)&(this->req).header.param = (int)uVar7;
  *(undefined4 *)((long)&(this->req).header.param + 4) = uVar4;
  local_70 = &(this->req).payload;
  local_78 = &(this->req).payload.field_2;
  (this->req).payload._M_dataplus._M_p = (pointer)local_78;
  pcVar2 = (req->payload)._M_dataplus._M_p;
  paVar1 = &(req->payload).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar5 = *(undefined8 *)((long)&(req->payload).field_2 + 8);
    local_78->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->req).payload.field_2 + 8) = uVar5;
  }
  else {
    (local_70->_M_dataplus)._M_p = pcVar2;
    local_78->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->req).payload._M_string_length = (req->payload)._M_string_length;
  (req->payload)._M_dataplus._M_p = (pointer)paVar1;
  (req->payload)._M_string_length = 0;
  (req->payload).field_2._M_local_buf[0] = '\0';
  (this->done).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->done)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->done).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->done).super__Function_base._M_functor + 8) = 0;
  (this->error).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->error)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->error).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->error).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->addr)._M_dataplus._M_p = (pointer)&(this->addr).field_2;
  pcVar2 = (addr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->addr,pcVar2,pcVar2 + addr->_M_string_length);
  this->timeout = timeout;
  local_68 = 0;
  uStack_60 = 0;
  iVar8 = socket(2,2,0);
  iVar8 = no_err(iVar8,"Could not open udp socket");
  local_7c = 1;
  iVar9 = setsockopt(iVar8,1,6,&local_7c,4);
  no_err(iVar9,"setsockopt SO_BROADCAST");
  local_7c = 4;
  iVar9 = setsockopt(iVar8,0,0x21,&local_7c,4);
  no_err(iVar9,"setscokopt TTL");
  local_68._0_4_ = CONCAT22(port << 8 | port >> 8,2);
  iVar9 = inet_aton((addr->_M_dataplus)._M_p,(in_addr *)((long)&local_68 + 4));
  no_err(iVar9,"inet_aton");
  (this->remote).sin_family = (undefined2)local_68;
  (this->remote).sin_port = local_68._2_2_;
  (this->remote).sin_addr = (in_addr)local_68._4_4_;
  *(undefined8 *)(this->remote).sin_zero = uStack_60;
  Subscriber::set_fd(&this->super_Subscriber,iVar8);
  Subscriber::set_expected(&this->super_Subscriber,4);
  return;
}

Assistant:

MultiQuery<REQ, RES>::MultiQuery(REQ &req, uint16_t port, std::string addr, int timeout) :
    Subscriber("MultiQuery"),
    req(std::move(req)),
    addr(addr), timeout(timeout) {

  struct sockaddr_in remote_address{};

  int sock = no_err(socket(AF_INET, SOCK_DGRAM, 0), "Could not open udp socket");

  int optval = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_BROADCAST, (void *) &optval, sizeof optval), "setsockopt SO_BROADCAST");
  optval = 4;
  no_err(setsockopt(sock, IPPROTO_IP, IP_MULTICAST_TTL, (void *) &optval, sizeof optval), "setscokopt TTL");

  remote_address.sin_family = AF_INET;
  remote_address.sin_port = htons(port);
  no_err(inet_aton(&addr[0], &remote_address.sin_addr), "inet_aton");
  remote = remote_address;
  set_fd(sock);
  set_expected(POLLOUT);
}